

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O1

REF_STATUS ref_subdiv_to_hex(REF_GRID ref_grid)

{
  int iVar1;
  REF_GEOM pRVar2;
  REF_CELL pRVar3;
  REF_INT *pRVar4;
  REF_INT *pRVar5;
  REF_DBL *pRVar6;
  REF_EDGE pRVar7;
  REF_FACE pRVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  REF_STATUS RVar14;
  undefined8 uVar15;
  long lVar16;
  REF_NODE pRVar17;
  long lVar18;
  ulong uVar19;
  char *pcVar20;
  long lVar21;
  bool bVar22;
  double dVar23;
  REF_INT node;
  REF_INT new_cell;
  REF_EDGE ref_edge;
  REF_FACE ref_face;
  REF_GLOB global;
  REF_CELL edg_cell;
  REF_INT nodes [27];
  REF_INT quad [27];
  REF_INT face_nodes [4];
  REF_INT bar [27];
  REF_INT local_20c;
  uint local_208;
  uint local_204;
  REF_INT local_200;
  REF_INT local_1fc;
  REF_EDGE local_1f8;
  void *local_1f0;
  REF_NODE local_1e8;
  REF_FACE local_1e0;
  uint local_1d4;
  REF_GLOB local_1d0;
  uint local_1c8;
  uint local_1c4;
  void *local_1c0;
  undefined8 local_1b8;
  uint local_1b0;
  uint local_1ac;
  uint local_1a8 [29];
  uint local_134;
  uint local_130;
  uint local_12c;
  uint local_128 [4];
  uint local_118;
  uint local_114;
  uint local_110;
  uint local_10c;
  REF_INT local_b8 [4];
  uint local_a8 [4];
  uint local_98;
  uint local_94;
  
  pRVar17 = ref_grid->node;
  pRVar2 = ref_grid->geom;
  uVar12 = ref_edge_create(&local_1f8,ref_grid);
  if (uVar12 != 0) {
    pcVar20 = "create edge";
    uVar15 = 0x9f4;
    goto LAB_001f96e5;
  }
  uVar12 = ref_face_create(&local_1e0,ref_grid);
  pRVar7 = local_1f8;
  if (uVar12 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",0x9f5,
           "ref_subdiv_to_hex",(ulong)uVar12,"create face");
    return uVar12;
  }
  if ((long)local_1f8->n < 0) {
    uVar12 = 1;
LAB_001f9795:
    bVar22 = false;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",0x9f6,
           "ref_subdiv_to_hex");
    local_1f0 = (void *)0x0;
  }
  else {
    local_1f0 = malloc((long)local_1f8->n << 2);
    if (local_1f0 == (void *)0x0) {
      uVar12 = 2;
      goto LAB_001f9795;
    }
    bVar22 = true;
    uVar12 = 0;
    if (0 < pRVar7->n) {
      lVar16 = 0;
      do {
        *(undefined4 *)((long)local_1f0 + lVar16 * 4) = 0xffffffff;
        lVar16 = lVar16 + 1;
      } while (lVar16 < pRVar7->n);
    }
  }
  pRVar8 = local_1e0;
  if (!bVar22) {
    return uVar12;
  }
  if ((long)local_1e0->n < 0) {
    uVar12 = 1;
LAB_001f981f:
    bVar22 = false;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",0x9f7,
           "ref_subdiv_to_hex");
    local_1c0 = (void *)0x0;
  }
  else {
    local_1c0 = malloc((long)local_1e0->n << 2);
    if (local_1c0 == (void *)0x0) {
      uVar12 = 2;
      goto LAB_001f981f;
    }
    bVar22 = true;
    if (0 < pRVar8->n) {
      lVar16 = 0;
      do {
        *(undefined4 *)((long)local_1c0 + lVar16 * 4) = 0xffffffff;
        lVar16 = lVar16 + 1;
      } while (lVar16 < pRVar8->n);
    }
  }
  if (!bVar22) {
    return uVar12;
  }
  local_20c = 0;
  local_1e8 = pRVar17;
  if (0 < local_1f8->n) {
    do {
      uVar13 = ref_node_next_global(local_1e8,&local_1d0);
      if (uVar13 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
               0x9fa,"ref_subdiv_to_hex",(ulong)uVar13,"next global");
        return uVar13;
      }
      uVar13 = ref_node_add(local_1e8,local_1d0,(REF_INT *)&local_204);
      if (uVar13 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
               0x9fb,"ref_subdiv_to_hex",(ulong)uVar13,"edge node");
        return uVar13;
      }
      *(uint *)((long)local_1f0 + (long)local_20c * 4) = local_204;
      uVar13 = ref_node_interpolate_edge
                         (local_1e8,local_1f8->e2n[(long)local_20c * 2],
                          local_1f8->e2n[local_20c * 2 + 1],0.5,local_204);
      if (uVar13 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
               0x9ff,"ref_subdiv_to_hex",(ulong)uVar13,"new reals");
        return uVar13;
      }
      if ((pRVar2->model != (void *)0x0) &&
         (uVar13 = ref_geom_add_constrain_midnode
                             (ref_grid,local_1f8->e2n[(long)local_20c * 2],
                              local_1f8->e2n[local_20c * 2 + 1],0.5,local_204), uVar13 != 0)) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
               0xa04,"ref_subdiv_to_hex",(ulong)uVar13,"new geom");
        return uVar13;
      }
      local_20c = local_20c + 1;
    } while (local_20c < local_1f8->n);
  }
  pRVar17 = local_1e8;
  pRVar3 = ref_grid->cell[3];
  local_1fc = 0;
  if (0 < local_1e0->n) {
    do {
      uVar13 = ref_node_next_global(pRVar17,&local_1d0);
      if (uVar13 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
               0xa09,"ref_subdiv_to_hex",(ulong)uVar13,"next global");
        return uVar13;
      }
      uVar13 = ref_node_add(pRVar17,local_1d0,(REF_INT *)&local_204);
      if (uVar13 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
               0xa0a,"ref_subdiv_to_hex",(ulong)uVar13,"face node");
        return uVar13;
      }
      *(uint *)((long)local_1c0 + (long)local_1fc * 4) = local_204;
      pRVar4 = local_1e0->f2n;
      lVar16 = 0;
      do {
        local_1a8[lVar16] = pRVar4[(long)local_1fc * 4 + lVar16];
        lVar16 = lVar16 + 1;
      } while (lVar16 != 3);
      local_1a8[3] = 0xffffffff;
      uVar13 = ref_cell_with(pRVar3,(REF_INT *)local_1a8,(REF_INT *)&local_208);
      if ((uVar13 != 0) && (uVar13 != 5)) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
               0xa11,"ref_subdiv_to_hex",(ulong)uVar13,"find tri");
        uVar12 = uVar13;
      }
      if ((uVar13 != 5) && (uVar13 != 0)) {
        return uVar12;
      }
      if ((long)(int)local_208 != -1) {
        local_1a8[3] = pRVar3->c2n[(long)pRVar3->size_per * (long)(int)local_208 + 3];
      }
      uVar13 = ref_node_interpolate_face(pRVar17,local_1a8[0],local_1a8[1],local_1a8[2],local_204);
      if (uVar13 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
               0xa15,"ref_subdiv_to_hex",(ulong)uVar13,"interp new face node");
        return uVar13;
      }
      if (((pRVar2->model != (void *)0x0) && (local_1a8[3] != 0xffffffff)) &&
         (uVar13 = ref_geom_add_constrain_inside_midnode(ref_grid,(REF_INT *)local_1a8,local_204),
         uVar13 != 0)) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
               0xa18,"ref_subdiv_to_hex",(ulong)uVar13,"geom constrain new face node");
        return uVar13;
      }
      local_1fc = local_1fc + 1;
    } while (local_1fc < local_1e0->n);
  }
  pRVar3 = ref_grid->cell[8];
  local_208 = 0;
  if (0 < pRVar3->max) {
    do {
      RVar14 = ref_cell_nodes(pRVar3,local_208,(REF_INT *)local_1a8);
      if (RVar14 == 0) {
        if (0 < pRVar3->face_per) {
          lVar21 = 0;
          lVar16 = 0;
          do {
            pRVar4 = pRVar3->c2n;
            pRVar5 = pRVar3->f2n;
            lVar18 = 0;
            do {
              local_b8[lVar18] =
                   pRVar4[(long)pRVar3->size_per * (long)(int)local_208 +
                          (long)*(int *)((long)pRVar5 + lVar18 * 4 + lVar21)];
              lVar18 = lVar18 + 1;
            } while (lVar18 != 4);
            uVar13 = ref_face_with(local_1e0,local_b8,&local_1fc);
            if (uVar13 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                     ,0xa29,"ref_subdiv_to_hex",(ulong)uVar13,"find face");
              printf("%d tri %d %d %d  %d\n",(ulong)local_208,(ulong)local_1a8[0],
                     (ulong)local_1a8[1],(ulong)local_1a8[2],(ulong)local_1a8[3]);
              goto LAB_001fa0dc;
            }
            if ((long)local_1fc == -1) {
              uVar15 = 0xa2a;
              goto LAB_001f9eec;
            }
            *(undefined4 *)((long)&local_1b8 + lVar16 * 4) =
                 *(undefined4 *)((long)local_1c0 + (long)local_1fc * 4);
            lVar16 = lVar16 + 1;
            lVar21 = lVar21 + 0x10;
          } while (lVar16 < pRVar3->face_per);
        }
        pRVar17 = local_1e8;
        if (0 < pRVar3->edge_per) {
          lVar16 = 0;
LAB_001f9d5b:
          lVar21 = (long)(int)local_208 * (long)pRVar3->size_per;
          uVar13 = ref_edge_with(local_1f8,pRVar3->c2n[pRVar3->e2n[lVar16 * 2] + lVar21],
                                 pRVar3->c2n[(long)(int)lVar21 + (long)pRVar3->e2n[lVar16 * 2 + 1]],
                                 &local_20c);
          if (uVar13 == 0) {
            if ((long)local_20c != -1) goto code_r0x001f9de2;
            uVar15 = 0xa32;
LAB_001f9eec:
            bVar22 = false;
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                   ,uVar15,"ref_subdiv_to_hex");
            uVar12 = 1;
            goto LAB_001fa0e3;
          }
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0xa31,"ref_subdiv_to_hex",(ulong)uVar13,"find edge");
          goto LAB_001fa0dc;
        }
LAB_001f9e09:
        uVar13 = ref_node_next_global(pRVar17,&local_1d0);
        if (uVar13 == 0) {
          uVar13 = ref_node_add(pRVar17,local_1d0,(REF_INT *)&local_204);
          uVar11 = local_a8[0];
          uVar10 = local_1ac;
          if (uVar13 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                   ,0xa37,"ref_subdiv_to_hex",(ulong)uVar13,"edge node");
            goto LAB_001f9e9d;
          }
          pRVar6 = pRVar17->real;
          uVar13 = pRVar3->node_per;
          lVar16 = 0;
          do {
            pRVar6[(long)(int)local_204 * 0xf + lVar16] = 0.0;
            if (0 < (int)uVar13) {
              dVar23 = pRVar6[(long)(int)local_204 * 0xf + lVar16];
              uVar19 = 0;
              do {
                dVar23 = dVar23 + pRVar6[lVar16 + (long)(int)local_1a8[uVar19] * 0xf] * 0.25;
                pRVar6[(long)(int)local_204 * 0xf + lVar16] = dVar23;
                uVar19 = uVar19 + 1;
              } while (uVar13 != uVar19);
            }
            lVar16 = lVar16 + 1;
          } while (lVar16 != 3);
          local_128[0] = local_1a8[0];
          local_128[1] = local_a8[0];
          local_128[2] = local_1ac;
          local_1d4 = local_a8[1];
          local_128[3] = local_a8[1];
          local_12c = local_a8[2];
          local_118 = local_a8[2];
          local_1c4 = local_1b0;
          local_114 = local_1b0;
          local_110 = local_204;
          local_1c8 = local_1b8._4_4_;
          local_10c = local_1b8._4_4_;
          uVar13 = ref_cell_add(ref_grid->cell[0xb],(REF_INT *)local_128,&local_200);
          uVar9 = (uint)local_1b8;
          if (uVar13 == 0) {
            local_128[0] = local_1a8[1];
            local_130 = local_a8[3];
            local_128[1] = local_a8[3];
            local_128[2] = uVar10;
            local_128[3] = uVar11;
            local_134 = local_98;
            local_118 = local_98;
            local_114 = (uint)local_1b8;
            local_110 = local_204;
            local_10c = local_1c4;
            uVar13 = ref_cell_add(ref_grid->cell[0xb],(REF_INT *)local_128,&local_200);
            uVar11 = local_94;
            if (uVar13 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                     ,0xa52,"ref_subdiv_to_hex",(ulong)uVar13,"add");
              goto LAB_001fa0dc;
            }
            local_128[0] = local_1a8[2];
            local_128[1] = local_1d4;
            local_128[2] = uVar10;
            local_128[3] = local_130;
            local_118 = local_94;
            local_114 = local_1c8;
            local_110 = local_204;
            local_1d4 = uVar9;
            local_10c = uVar9;
            uVar13 = ref_cell_add(ref_grid->cell[0xb],(REF_INT *)local_128,&local_200);
            if (uVar13 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                     ,0xa5c,"ref_subdiv_to_hex",(ulong)uVar13,"add");
              goto LAB_001f9e9d;
            }
            local_128[0] = local_1a8[3];
            local_128[1] = local_134;
            local_128[2] = local_1c4;
            local_128[3] = local_12c;
            local_118 = uVar11;
            local_114 = local_1d4;
            local_110 = local_204;
            local_10c = local_1c8;
            uVar13 = ref_cell_add(ref_grid->cell[0xb],(REF_INT *)local_128,&local_200);
            if (uVar13 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                     ,0xa66,"ref_subdiv_to_hex",(ulong)uVar13,"add");
              goto LAB_001fa0dc;
            }
            uVar13 = ref_cell_remove(pRVar3,local_208);
            bVar22 = uVar13 == 0;
            if (!bVar22) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                     ,0xa68,"ref_subdiv_to_hex",(ulong)uVar13,"remove tet");
              uVar12 = uVar13;
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                   ,0xa48,"ref_subdiv_to_hex",(ulong)uVar13,"add");
LAB_001fa0dc:
            bVar22 = false;
            uVar12 = uVar13;
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0xa36,"ref_subdiv_to_hex",(ulong)uVar13,"next global");
LAB_001f9e9d:
          bVar22 = false;
          uVar12 = uVar13;
        }
LAB_001fa0e3:
        pRVar17 = local_1e8;
        if (!bVar22) {
          return uVar12;
        }
      }
      local_208 = local_208 + 1;
    } while ((int)local_208 < pRVar3->max);
  }
  pRVar3 = ref_grid->cell[3];
  local_208 = 0;
  if (0 < pRVar3->max) {
    do {
      RVar14 = ref_cell_nodes(pRVar3,local_208,(REF_INT *)local_1a8);
      if (RVar14 == 0) {
        local_b8[2] = local_1a8[2];
        uVar12 = ref_face_with(local_1e0,local_b8,&local_1fc);
        if (uVar12 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0xa72,"ref_subdiv_to_hex",(ulong)uVar12,"find face");
          printf("%d tri %d %d %d  %d\n",(ulong)local_208,(ulong)local_1a8[0],(ulong)local_1a8[1],
                 (ulong)local_1a8[2],(ulong)local_1a8[3]);
          return uVar12;
        }
        if ((long)local_1fc == -1) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0xa73,"ref_subdiv_to_hex","tri face not found");
          return 1;
        }
        local_204 = *(uint *)((long)local_1c0 + (long)local_1fc * 4);
        local_128[ref_grid->cell[6]->node_per] = local_1a8[ref_grid->cell[3]->node_per];
        local_128[0] = local_1a8[0];
        uVar12 = ref_edge_with(local_1f8,local_1a8[0],local_1a8[1],&local_20c);
        if (uVar12 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0xa78,"ref_subdiv_to_hex",(ulong)uVar12,"find edge after");
          return uVar12;
        }
        local_128[1] = *(undefined4 *)((long)local_1f0 + (long)local_20c * 4);
        local_128[2] = local_204;
        uVar12 = ref_edge_with(local_1f8,local_1a8[2],local_1a8[0],&local_20c);
        if (uVar12 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0xa7b,"ref_subdiv_to_hex",(ulong)uVar12,"find edge before");
          return uVar12;
        }
        local_128[3] = *(undefined4 *)((long)local_1f0 + (long)local_20c * 4);
        uVar12 = ref_cell_add(ref_grid->cell[6],(REF_INT *)local_128,&local_200);
        if (uVar12 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0xa7d,"ref_subdiv_to_hex",(ulong)uVar12,"add");
          return uVar12;
        }
        local_128[0] = local_1a8[1];
        uVar12 = ref_edge_with(local_1f8,local_1a8[1],local_1a8[2],&local_20c);
        if (uVar12 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0xa7f,"ref_subdiv_to_hex",(ulong)uVar12,"find edge after");
          return uVar12;
        }
        local_128[1] = *(undefined4 *)((long)local_1f0 + (long)local_20c * 4);
        local_128[2] = local_204;
        uVar12 = ref_edge_with(local_1f8,local_1a8[0],local_1a8[1],&local_20c);
        if (uVar12 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0xa82,"ref_subdiv_to_hex",(ulong)uVar12,"find edge before");
          return uVar12;
        }
        local_128[3] = *(undefined4 *)((long)local_1f0 + (long)local_20c * 4);
        uVar12 = ref_cell_add(ref_grid->cell[6],(REF_INT *)local_128,&local_200);
        if (uVar12 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0xa84,"ref_subdiv_to_hex",(ulong)uVar12,"add");
          return uVar12;
        }
        local_128[0] = local_1a8[2];
        uVar12 = ref_edge_with(local_1f8,local_1a8[2],local_1a8[0],&local_20c);
        if (uVar12 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0xa86,"ref_subdiv_to_hex",(ulong)uVar12,"find edge after");
          return uVar12;
        }
        local_128[1] = *(uint *)((long)local_1f0 + (long)local_20c * 4);
        local_128[2] = local_204;
        uVar12 = ref_edge_with(local_1f8,local_1a8[1],local_1a8[2],&local_20c);
        if (uVar12 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0xa89,"ref_subdiv_to_hex",(ulong)uVar12,"find edge before");
          return uVar12;
        }
        local_128[3] = *(uint *)((long)local_1f0 + (long)local_20c * 4);
        uVar12 = ref_cell_add(ref_grid->cell[6],(REF_INT *)local_128,&local_200);
        if (uVar12 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0xa8b,"ref_subdiv_to_hex",(ulong)uVar12,"add");
          return uVar12;
        }
        uVar12 = ref_cell_remove(pRVar3,local_208);
        if (uVar12 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0xa8c,"ref_subdiv_to_hex",(ulong)uVar12,"remove tri");
          return uVar12;
        }
      }
      local_208 = local_208 + 1;
    } while ((int)local_208 < pRVar3->max);
  }
  pRVar3 = ref_grid->cell[0];
  uVar12 = ref_cell_create((REF_CELL *)&local_1b8,REF_CELL_EDG);
  if (uVar12 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",0xa90,
           "ref_subdiv_to_hex",(ulong)uVar12,"new edges");
    return uVar12;
  }
  local_208 = 0;
  if (0 < pRVar3->max) {
    do {
      RVar14 = ref_cell_nodes(pRVar3,local_208,(REF_INT *)local_1a8);
      if (RVar14 == 0) {
        iVar1 = ref_grid->cell[0]->node_per;
        local_a8[iVar1] = local_1a8[iVar1];
        local_a8[0] = local_1a8[0];
        uVar12 = ref_edge_with(local_1f8,local_1a8[0],local_1a8[1],&local_20c);
        if (uVar12 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0xa95,"ref_subdiv_to_hex",(ulong)uVar12,"find edge");
          return uVar12;
        }
        local_a8[1] = *(undefined4 *)((long)local_1f0 + (long)local_20c * 4);
        uVar12 = ref_cell_add((REF_CELL)CONCAT44(local_1b8._4_4_,(uint)local_1b8),
                              (REF_INT *)local_a8,&local_200);
        if (uVar12 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0xa97,"ref_subdiv_to_hex",(ulong)uVar12,"add");
          return uVar12;
        }
        local_a8[0] = *(uint *)((long)local_1f0 + (long)local_20c * 4);
        local_a8[1] = local_1a8[1];
        uVar12 = ref_cell_add((REF_CELL)CONCAT44(local_1b8._4_4_,(uint)local_1b8),
                              (REF_INT *)local_a8,&local_200);
        pRVar17 = local_1e8;
        if (uVar12 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0xa9a,"ref_subdiv_to_hex",(ulong)uVar12,"add");
          return uVar12;
        }
      }
      local_208 = local_208 + 1;
    } while ((int)local_208 < pRVar3->max);
  }
  uVar12 = ref_cell_free(ref_grid->cell[0]);
  if (uVar12 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",0xa9c,
           "ref_subdiv_to_hex",(ulong)uVar12,"free old edge");
    return uVar12;
  }
  ref_grid->cell[0] = (REF_CELL)CONCAT44(local_1b8._4_4_,(uint)local_1b8);
  if (local_1c0 != (void *)0x0) {
    free(local_1c0);
  }
  if (local_1f0 != (void *)0x0) {
    free(local_1f0);
  }
  uVar12 = ref_face_free(local_1e0);
  if (uVar12 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",0xaa1,
           "ref_subdiv_to_hex",(ulong)uVar12,"free face");
    return uVar12;
  }
  uVar12 = ref_edge_free(local_1f8);
  if (uVar12 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",0xaa2,
           "ref_subdiv_to_hex",(ulong)uVar12,"free edge");
    return uVar12;
  }
  uVar12 = ref_node_synchronize_globals(pRVar17);
  if (uVar12 == 0) {
    return 0;
  }
  pcVar20 = "sync globals";
  uVar15 = 0xaa4;
LAB_001f96e5:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",uVar15,
         "ref_subdiv_to_hex",(ulong)uVar12,pcVar20);
  return uVar12;
code_r0x001f9de2:
  local_a8[lVar16] = *(uint *)((long)local_1f0 + (long)local_20c * 4);
  lVar16 = lVar16 + 1;
  if (pRVar3->edge_per <= lVar16) goto LAB_001f9e09;
  goto LAB_001f9d5b;
}

Assistant:

REF_FCN REF_STATUS ref_subdiv_to_hex(REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_CELL ref_cell;
  REF_EDGE ref_edge;
  REF_FACE ref_face;
  REF_INT *edge_node, *face_node, face, edge, node, new_cell, i;
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER], face_nodes[4];
  REF_INT quad[REF_CELL_MAX_SIZE_PER], bar[REF_CELL_MAX_SIZE_PER];
  REF_GLOB global;
  REF_CELL edg_cell;

  RSS(ref_edge_create(&ref_edge, ref_grid), "create edge");
  RSS(ref_face_create(&ref_face, ref_grid), "create face");
  ref_malloc_init(edge_node, ref_edge_n(ref_edge), REF_INT, REF_EMPTY);
  ref_malloc_init(face_node, ref_face_n(ref_face), REF_INT, REF_EMPTY);

  each_ref_edge(ref_edge, edge) {
    RSS(ref_node_next_global(ref_node, &global), "next global");
    RSS(ref_node_add(ref_node, global, &node), "edge node");
    edge_node[edge] = node;
    RSS(ref_node_interpolate_edge(ref_node, ref_edge_e2n(ref_edge, 0, edge),
                                  ref_edge_e2n(ref_edge, 1, edge), 0.5, node),
        "new reals");
    if (ref_geom_model_loaded(ref_geom))
      RSS(ref_geom_add_constrain_midnode(
              ref_grid, ref_edge_e2n(ref_edge, 0, edge),
              ref_edge_e2n(ref_edge, 1, edge), 0.5, node),
          "new geom");
  }

  ref_cell = ref_grid_tri(ref_grid);
  each_ref_face(ref_face, face) {
    RSS(ref_node_next_global(ref_node, &global), "next global");
    RSS(ref_node_add(ref_node, global, &node), "face node");
    face_node[face] = node;

    for (i = 0; i < 3; i++) {
      nodes[i] = ref_face_f2n(ref_face, i, face);
    }
    nodes[3] = REF_EMPTY;
    RXS(ref_cell_with(ref_cell, nodes, &cell), REF_NOT_FOUND, "find tri");
    if (REF_EMPTY != cell) nodes[3] = ref_cell_c2n(ref_cell, 3, cell);

    RSS(ref_node_interpolate_face(ref_node, nodes[0], nodes[1], nodes[2], node),
        "interp new face node");
    if (ref_geom_model_loaded(ref_geom) && REF_EMPTY != nodes[3]) {
      RSS(ref_geom_add_constrain_inside_midnode(ref_grid, nodes, node),
          "geom constrain new face node");
    }
  }

  ref_cell = ref_grid_tet(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    REF_INT tet_face_nodes[4], tet_edge_nodes[6];
    REF_INT cell_face, cell_edge, cell_node;
    REF_INT hex[REF_CELL_MAX_SIZE_PER];

    each_ref_cell_cell_face(ref_cell, cell_face) {
      /* repeat first node to mark tri */
      for (i = 0; i < 4; i++)
        face_nodes[i] = ref_cell_f2n(ref_cell, i, cell_face, cell);
      RSB(ref_face_with(ref_face, face_nodes, &face), "find face", {
        printf("%d tri %d %d %d  %d\n", cell, nodes[0], nodes[1], nodes[2],
               nodes[3]);
      });
      RUS(REF_EMPTY, face, "tet face not found");
      tet_face_nodes[cell_face] = face_node[face];
    }

    each_ref_cell_cell_edge(ref_cell, cell_edge) {
      RSS(ref_edge_with(ref_edge, ref_cell_e2n(ref_cell, 0, cell_edge, cell),
                        ref_cell_e2n(ref_cell, 1, cell_edge, cell), &edge),
          "find edge");
      RUS(REF_EMPTY, edge, "tet edge not found");
      tet_edge_nodes[cell_edge] = edge_node[edge];
    }

    RSS(ref_node_next_global(ref_node, &global), "next global");
    RSS(ref_node_add(ref_node, global, &node), "edge node");
    for (i = 0; i < 3; i++) {
      ref_node_xyz(ref_node, i, node) = 0.0;
      each_ref_cell_cell_node(ref_cell, cell_node) {
        ref_node_xyz(ref_node, i, node) +=
            0.25 * ref_node_xyz(ref_node, i, nodes[cell_node]);
      }
    }

    hex[0] = nodes[0];
    hex[1] = tet_edge_nodes[0];
    hex[2] = tet_face_nodes[3];
    hex[3] = tet_edge_nodes[1];
    hex[4] = tet_edge_nodes[2];
    hex[5] = tet_face_nodes[2];
    hex[6] = node;
    hex[7] = tet_face_nodes[1];
    RSS(ref_cell_add(ref_grid_hex(ref_grid), hex, &new_cell), "add");

    hex[0] = nodes[1];
    hex[1] = tet_edge_nodes[3];
    hex[2] = tet_face_nodes[3];
    hex[3] = tet_edge_nodes[0];
    hex[4] = tet_edge_nodes[4];
    hex[5] = tet_face_nodes[0];
    hex[6] = node;
    hex[7] = tet_face_nodes[2];
    RSS(ref_cell_add(ref_grid_hex(ref_grid), hex, &new_cell), "add");

    hex[0] = nodes[2];
    hex[1] = tet_edge_nodes[1];
    hex[2] = tet_face_nodes[3];
    hex[3] = tet_edge_nodes[3];
    hex[4] = tet_edge_nodes[5];
    hex[5] = tet_face_nodes[1];
    hex[6] = node;
    hex[7] = tet_face_nodes[0];
    RSS(ref_cell_add(ref_grid_hex(ref_grid), hex, &new_cell), "add");

    hex[0] = nodes[3];
    hex[1] = tet_edge_nodes[4];
    hex[2] = tet_face_nodes[2];
    hex[3] = tet_edge_nodes[2];
    hex[4] = tet_edge_nodes[5];
    hex[5] = tet_face_nodes[0];
    hex[6] = node;
    hex[7] = tet_face_nodes[1];
    RSS(ref_cell_add(ref_grid_hex(ref_grid), hex, &new_cell), "add");

    RSS(ref_cell_remove(ref_cell, cell), "remove tet");
  }

  ref_cell = ref_grid_tri(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    for (i = 0; i < 3; i++) face_nodes[i] = nodes[i];
    face_nodes[3] = face_nodes[0]; /* repeat first node to mark tri */
    RSB(ref_face_with(ref_face, face_nodes, &face), "find face", {
      printf("%d tri %d %d %d  %d\n", cell, nodes[0], nodes[1], nodes[2],
             nodes[3]);
    });
    RUS(REF_EMPTY, face, "tri face not found");
    node = face_node[face];
    quad[ref_cell_id_index(ref_grid_qua(ref_grid))] =
        nodes[ref_cell_id_index(ref_grid_tri(ref_grid))];
    quad[0] = nodes[0];
    RSS(ref_edge_with(ref_edge, nodes[0], nodes[1], &edge), "find edge after");
    quad[1] = edge_node[edge];
    quad[2] = node;
    RSS(ref_edge_with(ref_edge, nodes[2], nodes[0], &edge), "find edge before");
    quad[3] = edge_node[edge];
    RSS(ref_cell_add(ref_grid_qua(ref_grid), quad, &new_cell), "add");
    quad[0] = nodes[1];
    RSS(ref_edge_with(ref_edge, nodes[1], nodes[2], &edge), "find edge after");
    quad[1] = edge_node[edge];
    quad[2] = node;
    RSS(ref_edge_with(ref_edge, nodes[0], nodes[1], &edge), "find edge before");
    quad[3] = edge_node[edge];
    RSS(ref_cell_add(ref_grid_qua(ref_grid), quad, &new_cell), "add");
    quad[0] = nodes[2];
    RSS(ref_edge_with(ref_edge, nodes[2], nodes[0], &edge), "find edge after");
    quad[1] = edge_node[edge];
    quad[2] = node;
    RSS(ref_edge_with(ref_edge, nodes[1], nodes[2], &edge), "find edge before");
    quad[3] = edge_node[edge];
    RSS(ref_cell_add(ref_grid_qua(ref_grid), quad, &new_cell), "add");
    RSS(ref_cell_remove(ref_cell, cell), "remove tri");
  }

  ref_cell = ref_grid_edg(ref_grid);
  RSS(ref_cell_create(&edg_cell, REF_CELL_EDG), "new edges");
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    bar[ref_cell_id_index(ref_grid_edg(ref_grid))] =
        nodes[ref_cell_id_index(ref_grid_edg(ref_grid))];
    bar[0] = nodes[0];
    RSS(ref_edge_with(ref_edge, nodes[0], nodes[1], &edge), "find edge");
    bar[1] = edge_node[edge];
    RSS(ref_cell_add(edg_cell, bar, &new_cell), "add");
    bar[0] = edge_node[edge];
    bar[1] = nodes[1];
    RSS(ref_cell_add(edg_cell, bar, &new_cell), "add");
  }
  RSS(ref_cell_free(ref_grid_edg(ref_grid)), "free old edge");
  ref_grid_edg(ref_grid) = edg_cell;

  ref_free(face_node);
  ref_free(edge_node);
  RSS(ref_face_free(ref_face), "free face");
  RSS(ref_edge_free(ref_edge), "free edge");

  RSS(ref_node_synchronize_globals(ref_node), "sync globals");

  return REF_SUCCESS;
}